

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

TSTNode<unsigned_int> * __thiscall
BurstRecursive<unsigned_int>::operator()
          (BurstRecursive<unsigned_int> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uint *oracle,
          size_t depth)

{
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_01;
  pointer ppuVar1;
  uchar *puVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  TSTNode<unsigned_int> *pTVar6;
  TSTNode<unsigned_int> *pTVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  DI __d;
  BurstSimple<unsigned_int> local_61;
  TSTNode<unsigned_int> *local_60;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_58;
  BurstRecursive<unsigned_int> *local_50;
  long local_48;
  ulong local_40;
  DI local_38;
  
  local_50 = this;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"BurstRecursive() bucket.size()=",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," depth=",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_60 = BurstSimple<unsigned_int>::operator()(&local_61,bucket,oracle,depth);
  bucket_00 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
              (local_60->buckets)._M_elems[0];
  bucket_01 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
              (local_60->buckets)._M_elems[1];
  local_58 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (local_60->buckets)._M_elems[2];
  uVar4 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar11 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  local_48 = ((long)(bucket_01->
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(bucket_01->
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) + uVar11;
  if (((long)(local_58->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(local_58->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3) + local_48 != uVar4) {
    __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                  ,0x6c,
                  "TSTNode<CharT> *BurstRecursive<unsigned int>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned int, BucketT = std::vector<unsigned char *>]"
                 );
  }
  uVar5 = (ulong)((float)uVar4 * 0.7);
  uVar4 = 100;
  if (100 < (uint)uVar5) {
    uVar4 = uVar5 & 0xffffffff;
  }
  if (uVar4 < uVar11) {
    local_40 = uVar4;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket0: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar4 = 0;
      do {
        puVar2 = ppuVar1[uVar4];
        if (puVar2 == (uchar *)0x0) goto LAB_00218ab3;
        if (puVar2[depth] == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar10 = uVar10 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar10 = uVar10 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        oracle[uVar4] = uVar10;
        uVar4 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar4 < (ulong)(lVar8 >> 3));
    }
    pTVar6 = operator()(local_50,bucket_00,oracle,depth);
    (local_60->buckets)._M_elems[0] = pTVar6;
    ppuVar1 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(bucket_00);
    *(byte *)&(local_60->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(local_60->is_tst).super__Base_bitset<1UL>._M_w | 1;
    uVar4 = local_40;
  }
  if ((uVar4 < (ulong)((long)(bucket_01->
                             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(bucket_01->
                             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3)) &&
     ((char)local_60->pivot != '\0')) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket1: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (bucket_01->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(bucket_01->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar5 = 0;
      do {
        puVar2 = ppuVar1[uVar5];
        if (puVar2 == (uchar *)0x0) goto LAB_00218ab3;
        if (puVar2[depth + 4] == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (uint)puVar2[depth + 4] << 0x18;
          if (puVar2[depth + 5] != 0) {
            uVar10 = uVar10 | (uint)puVar2[depth + 5] << 0x10;
            if (puVar2[depth + 6] != '\0') {
              uVar10 = uVar10 | CONCAT11(puVar2[depth + 6],puVar2[depth + 7]);
            }
          }
        }
        oracle[uVar11 + uVar5] = uVar10;
        uVar5 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar5 < (ulong)(lVar8 >> 3));
    }
    pTVar7 = operator()(local_50,bucket_01,oracle + uVar11,depth + 4);
    pTVar6 = local_60;
    (local_60->buckets)._M_elems[1] = pTVar7;
    ppuVar1 = (bucket_01->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(bucket_01);
    *(byte *)&(pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 2;
  }
  if (uVar4 < (ulong)((long)(local_58->
                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_58->
                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3)) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket2: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (local_58->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(local_58->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar4 = 0;
      do {
        puVar2 = ppuVar1[uVar4];
        if (puVar2 == (uchar *)0x0) {
LAB_00218ab3:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x38,"uint32_t get_char(unsigned char *, size_t)");
        }
        if (puVar2[depth] == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar10 = uVar10 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar10 = uVar10 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        oracle[local_48 + uVar4] = uVar10;
        uVar4 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar4 < (ulong)(lVar8 >> 3));
    }
    pTVar7 = operator()(local_50,local_58,oracle + local_48,depth);
    pTVar6 = local_60;
    (local_60->buckets)._M_elems[2] = pTVar7;
    ppuVar1 = (local_58->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(local_58);
    *(byte *)&(pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 4;
  }
  operator()<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::DI::~DI(&local_38);
  return local_60;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}